

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

void __thiscall CVmTimeZone::local_to_utc(CVmTimeZone *this,int32_t *dayno,int32_t *daytime)

{
  vmtzquery result;
  vmtzquery local_30;
  
  query(this,&local_30,*dayno,*daytime,1);
  *daytime = *daytime - (local_30.save + local_30.gmtofs);
  caldate_t::normalize(dayno,daytime);
  return;
}

Assistant:

void CVmTimeZone::local_to_utc(int32_t &dayno, int32_t &daytime)
{
    /* look up the time zone information at the given local time */
    vmtzquery result;
    query(&result, dayno, daytime, TRUE);
    
    /* adjust the time to local by subtracting the GMT offset */
    daytime -= result.gmtofs + result.save;
    caldate_t::normalize(dayno, daytime);
}